

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O2

void __thiscall QGestureManager::~QGestureManager(QGestureManager *this)

{
  Span *pSVar1;
  long *plVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  piter local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007c05c0;
  qDeleteAll<QMultiMap<Qt::GestureType,QGestureRecognizer*>>
            ((QMultiMap<Qt::GestureType,_QGestureRecognizer_*> *)(this + 0x10));
  local_38 = (piter)QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::cbegin
                              ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)(this + 0x50));
  while( true ) {
    if (local_38.d == (Data<QHashPrivate::Node<QGestureRecognizer_*,_QSet<QGesture_*>_>_> *)0x0 &&
        local_38.bucket == 0) break;
    pSVar1 = (local_38.d)->spans;
    uVar3 = local_38.bucket >> 7;
    qDeleteAll<QSet<QGesture*>>
              ((QSet<QGesture_*> *)
               (pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_38.bucket & 0x7f]].storage.
                data + 8));
    plVar2 = *(long **)(local_38.d)->spans[local_38.bucket >> 7].entries
                       [(local_38.d)->spans[local_38.bucket >> 7].offsets
                        [(uint)local_38.bucket & 0x7f]].storage.data;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    QHashPrivate::iterator<QHashPrivate::Node<QGestureRecognizer_*,_QSet<QGesture_*>_>_>::operator++
              (&local_38);
  }
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)(this + 0x60));
  QHash<QGesture_*,_QGestureRecognizer_*>::~QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)(this + 0x58));
  QHash<QGestureRecognizer_*,_QSet<QGesture_*>_>::~QHash
            ((QHash<QGestureRecognizer_*,_QSet<QGesture_*>_> *)(this + 0x50));
  QHash<QGesture_*,_QPointer<QWidget>_>::~QHash
            ((QHash<QGesture_*,_QPointer<QWidget>_> *)(this + 0x40));
  QHash<QGesture_*,_QObject_*>::~QHash((QHash<QGesture_*,_QObject_*> *)(this + 0x38));
  QHash<QGesture_*,_QGestureRecognizer_*>::~QHash
            ((QHash<QGesture_*,_QGestureRecognizer_*> *)(this + 0x30));
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QGestureManager::ObjectGesture,_QList<QGesture_*>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QGestureManager::ObjectGesture,_QList<QGesture_*>,_std::less<QGestureManager::ObjectGesture>,_std::allocator<std::pair<const_QGestureManager::ObjectGesture,_QList<QGesture_*>_>_>_>_>_>
              *)(this + 0x28));
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)(this + 0x20));
  QHash<QGesture_*,_QHashDummyValue>::~QHash((QHash<QGesture_*,_QHashDummyValue> *)(this + 0x18));
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<Qt::GestureType,_QGestureRecognizer_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QGestureRecognizer_*>_>_>_>_>
              *)(this + 0x10));
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGestureManager::~QGestureManager()
{
    qDeleteAll(m_recognizers);
    for (auto it = m_obsoleteGestures.cbegin(), end = m_obsoleteGestures.cend(); it != end; ++it) {
        qDeleteAll(it.value());
        delete it.key();
    }
}